

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_type_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ftpstate instate_00;
  char *pcVar7;
  
  if (99 < ftpcode - 200U) {
    Curl_failf(conn->data,"Couldn\'t set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if (ftpcode != 200) {
    Curl_infof(conn->data,"Got a %03d response code instead of the assumed 200\n");
  }
  switch(instate) {
  case FTP_TYPE:
    CVar2 = ftp_state_size(conn);
    return CVar2;
  case FTP_LIST_TYPE:
    pCVar1 = conn->data;
    if (((((pCVar1->set).ftp_filemethod == FTPFILE_NOCWD) &&
         (pcVar4 = (pCVar1->state).path, pcVar4 != (char *)0x0)) && (*pcVar4 != '\0')) &&
       (pcVar3 = strchr(pcVar4,0x2f), pcVar3 != (char *)0x0)) {
      pcVar4 = (*Curl_cstrdup)(pcVar4);
      if (pcVar4 != (char *)0x0) {
        sVar5 = strlen(pcVar4);
        if ((pcVar4[sVar5 - 1] != '/') && (pcVar3 = strrchr(pcVar4,0x2f), pcVar3 != (char *)0x0)) {
          pcVar3[1] = '\0';
        }
        goto LAB_0057f89c;
      }
    }
    else {
      pcVar4 = (char *)0x0;
LAB_0057f89c:
      pcVar3 = (pCVar1->set).str[6];
      if ((pcVar3 == (char *)0x0) && (pcVar3 = "LIST", (pCVar1->set).ftp_list_only != false)) {
        pcVar3 = "NLST";
      }
      pcVar7 = " ";
      pcVar6 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        pcVar7 = "";
        pcVar6 = "";
      }
      pcVar3 = curl_maprintf("%s%s%s",pcVar3,pcVar7,pcVar6);
      if (pcVar3 != (char *)0x0) {
        CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",pcVar3);
        (*Curl_cfree)(pcVar4);
        (*Curl_cfree)(pcVar3);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        (conn->proto).ftpc.state = FTP_LIST;
        goto switchD_0057f7cf_default;
      }
      (*Curl_cfree)(pcVar4);
    }
    CVar2 = CURLE_OUT_OF_MEMORY;
    break;
  case FTP_RETR_TYPE:
    instate_00 = FTP_RETR_PREQUOTE;
    goto LAB_0057f81b;
  case FTP_STOR_TYPE:
    instate_00 = FTP_STOR_PREQUOTE;
LAB_0057f81b:
    CVar2 = ftp_state_quote(conn,true,instate_00);
    return CVar2;
  default:
switchD_0057f7cf_default:
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_type_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data=conn->data;

  if(ftpcode/100 != 2) {
    /* "sasserftpd" and "(u)r(x)bot ftpd" both responds with 226 after a
       successful 'TYPE I'. While that is not as RFC959 says, it is still a
       positive response code and we allow that. */
    failf(data, "Couldn't set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if(ftpcode != 200)
    infof(data, "Got a %03d response code instead of the assumed 200\n",
          ftpcode);

  if(instate == FTP_TYPE)
    result = ftp_state_size(conn);
  else if(instate == FTP_LIST_TYPE)
    result = ftp_state_list(conn);
  else if(instate == FTP_RETR_TYPE)
    result = ftp_state_retr_prequote(conn);
  else if(instate == FTP_STOR_TYPE)
    result = ftp_state_stor_prequote(conn);

  return result;
}